

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

ssize_t __thiscall DomBrush::read(DomBrush *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  int iVar2;
  DomColor *this_00;
  DomProperty *this_01;
  DomGradient *this_02;
  size_t sVar3;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  long lVar4;
  undefined4 in_register_00000034;
  QXmlStreamReader *this_03;
  QXmlStreamAttribute *attribute;
  QXmlStreamAttribute *pQVar5;
  long in_FS_OFFSET;
  QStringView other;
  QStringView other_00;
  QStringView other_01;
  QStringBuilder<QLatin1String,_const_QStringView_&> local_98;
  QArrayDataPointer<char16_t> local_80;
  QStringView local_68;
  QArrayDataPointer<QXmlStreamAttribute> local_50;
  long local_38;
  
  this_03 = (QXmlStreamReader *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  pQVar5 = local_50.ptr;
  for (lVar4 = 0; local_50.size * 0x68 != lVar4; lVar4 = lVar4 + 0x68) {
    local_68.m_data = *(storage_type_conflict **)(pQVar5 + 8);
    local_68.m_size = *(qsizetype *)(pQVar5 + 0x10);
    Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"brushstyle",10);
    local_98.a.m_size = local_80.size;
    local_98.a.m_data = (char *)local_80.ptr;
    bVar1 = comparesEqual(&local_68,(QStringView *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    if (bVar1) {
      local_98.a.m_data = *(char **)(local_50.ptr + lVar4 + 0x50);
      local_98.a.m_size = *(qsizetype *)(local_50.ptr + lVar4 + 0x58);
      QStringView::toString((QString *)&local_80,(QStringView *)&local_98);
      setAttributeBrushStyle(this,(QString *)&local_80);
    }
    else {
      local_98.a.m_size = 0x15;
      local_98.a.m_data = "Unexpected attribute ";
      local_98.b = &local_68;
      QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                ((QString *)&local_80,&local_98);
      QXmlStreamReader::raiseError((QString *)this_03);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    pQVar5 = pQVar5 + 0x68;
  }
  do {
    while( true ) {
      bVar1 = QXmlStreamReader::hasError(this_03);
      if (bVar1) goto LAB_001595c8;
      iVar2 = QXmlStreamReader::readNext();
      if (iVar2 != 4) break;
      local_68.m_size = -0x5555555555555556;
      local_68.m_data = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
      local_68 = (QStringView)QXmlStreamReader::name();
      Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"color",5);
      sVar3 = 0;
      other.m_data = local_80.ptr;
      other.m_size = local_80.size;
      iVar2 = QStringView::compare(&local_68,other,CaseInsensitive);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
      if (iVar2 == 0) {
        this_00 = (DomColor *)operator_new(0x18);
        this_00->m_attr_alpha = 0;
        this_00->m_has_attr_alpha = false;
        *(undefined3 *)&this_00->field_0x5 = 0;
        this_00->m_children = 0;
        this_00->m_red = 0;
        this_00->m_green = 0;
        this_00->m_blue = 0;
        DomColor::read(this_00,__fd,__buf_00,sVar3);
        setElementColor(this,this_00);
      }
      else {
        Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"texture",7);
        sVar3 = 0;
        other_00.m_data = local_80.ptr;
        other_00.m_size = local_80.size;
        iVar2 = QStringView::compare(&local_68,other_00,CaseInsensitive);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
        if (iVar2 == 0) {
          this_01 = (DomProperty *)operator_new(0x178);
          memset(this_01,0,0x178);
          DomProperty::read(this_01,__fd,__buf_01,sVar3);
          setElementTexture(this,this_01);
        }
        else {
          Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"gradient",8);
          sVar3 = 0;
          other_01.m_data = local_80.ptr;
          other_01.m_size = local_80.size;
          iVar2 = QStringView::compare(&local_68,other_01,CaseInsensitive);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
          if (iVar2 == 0) {
            this_02 = (DomGradient *)operator_new(0x118);
            memset(this_02,0,0x118);
            DomGradient::DomGradient(this_02);
            DomGradient::read(this_02,__fd,__buf_02,sVar3);
            setElementGradient(this,this_02);
          }
          else {
            local_98.a.m_size = 0x13;
            local_98.a.m_data = "Unexpected element ";
            local_98.b = &local_68;
            QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                      ((QString *)&local_80,&local_98);
            QXmlStreamReader::raiseError((QString *)this_03);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
          }
        }
      }
    }
  } while (iVar2 != 5);
LAB_001595c8:
  QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomBrush::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"brushstyle"_s) {
            setAttributeBrushStyle(attribute.value().toString());
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"color"_s, Qt::CaseInsensitive)) {
                auto *v = new DomColor();
                v->read(reader);
                setElementColor(v);
                continue;
            }
            if (!tag.compare(u"texture"_s, Qt::CaseInsensitive)) {
                auto *v = new DomProperty();
                v->read(reader);
                setElementTexture(v);
                continue;
            }
            if (!tag.compare(u"gradient"_s, Qt::CaseInsensitive)) {
                auto *v = new DomGradient();
                v->read(reader);
                setElementGradient(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}